

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::ParentDir_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  size_type __n;
  allocator<char> local_29;
  string_view filename_local;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&filename_local,'/',0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_18 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&filename_local,0,__n);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_18,&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::ParentDir(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos == cm::string_view::npos) {
    return std::string();
  }
  return std::string(filename.substr(0, slashPos));
}